

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O3

void __thiscall adios2::transport::ShmSystemV::Close(ShmSystemV *this)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  char cVar9;
  string __str;
  string local_190;
  string local_170;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  char *local_f0;
  uint local_e8;
  char local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"close","");
  Transport::ProfilerStart(&this->super_Transport,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar4 = shmdt(this->m_Buffer);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"close","");
  Transport::ProfilerStop(&this->super_Transport,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (iVar4 < 1) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"transport::shm::ShmSystemV","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Close","");
    uVar1 = this->m_Size;
    cVar9 = '\x01';
    if (9 < uVar1) {
      uVar7 = uVar1;
      cVar3 = '\x04';
      do {
        cVar9 = cVar3;
        if (uVar7 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_00668bce;
        }
        if (uVar7 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_00668bce;
        }
        if (uVar7 < 10000) goto LAB_00668bce;
        bVar2 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar3 = cVar9 + '\x04';
      } while (bVar2);
      cVar9 = cVar9 + '\x01';
    }
LAB_00668bce:
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,uVar1);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x751483);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_140 = *plVar6;
      lStack_138 = plVar5[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar6;
      local_150 = (long *)*plVar5;
    }
    local_148 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_120 = *plVar6;
      lStack_118 = plVar5[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar6;
      local_130 = (long *)*plVar5;
    }
    local_128 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,
                                (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110.field_2._8_8_ = plVar5[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_110._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_170,&local_190,&local_110,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (this->m_RemoveAtClose == true) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"close","");
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    iVar4 = shmctl(this->m_ShmID,0,(shmid_ds *)0x0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"close","");
    Transport::ProfilerStop(&this->super_Transport,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (iVar4 < 1) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"transport::shm::ShmSystemV","");
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Close","");
      uVar1 = this->m_Size;
      cVar9 = '\x01';
      if (9 < uVar1) {
        uVar7 = uVar1;
        cVar3 = '\x04';
        do {
          cVar9 = cVar3;
          if (uVar7 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00668f2d;
          }
          if (uVar7 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00668f2d;
          }
          if (uVar7 < 10000) goto LAB_00668f2d;
          bVar2 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar3 = cVar9 + '\x04';
        } while (bVar2);
        cVar9 = cVar9 + '\x01';
      }
LAB_00668f2d:
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,uVar1);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x7514be);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_140 = *plVar6;
        lStack_138 = plVar5[3];
        local_150 = &local_140;
      }
      else {
        local_140 = *plVar6;
        local_150 = (long *)*plVar5;
      }
      local_148 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_120 = *plVar6;
        lStack_118 = plVar5[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar6;
        local_130 = (long *)*plVar5;
      }
      local_128 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,
                                  (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_110.field_2._M_allocated_capacity = *psVar8;
        local_110.field_2._8_8_ = plVar5[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar8;
        local_110._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_110._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_d0,&local_170,&local_190,&local_110,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  (this->super_Transport).m_IsOpen = false;
  return;
}

Assistant:

void ShmSystemV::Close()
{
    ProfilerStart("close");
    int result = shmdt(m_Buffer);
    ProfilerStop("close");
    if (result < 1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::shm::ShmSystemV", "Close",
                                              "failed to detach shared memory segment of size " +
                                                  std::to_string(m_Size) + " and name " + m_Name);
    }

    if (m_RemoveAtClose)
    {
        ProfilerStart("close");
        const int remove = shmctl(m_ShmID, IPC_RMID, NULL);
        ProfilerStop("close");
        if (remove < 1)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::shm::ShmSystemV", "Close",
                "failed to remove shared memory segment of size " + std::to_string(m_Size) +
                    " and name " + m_Name);
        }
    }

    m_IsOpen = false;
}